

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O2

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::InitFromFile(KLVFilePacket *this,IFileReader *Reader)

{
  undefined8 *puVar1;
  undefined4 *__dest;
  char cVar2;
  int iVar3;
  ILogSink *pIVar4;
  int64_t iVar5;
  IFileReader *in_RDX;
  uint uVar6;
  undefined1 *puVar7;
  ui32_t read_count;
  byte_t tmp_data [32];
  ui64_t tmp_size;
  ui64Printer tmp_size_str;
  Result_t result;
  
  *(undefined8 *)(Reader + 8) = 0;
  *(undefined4 *)(Reader + 0x10) = 0;
  *(undefined4 *)(Reader + 0x60) = 0;
  *(undefined8 *)(Reader + 0x18) = 0;
  *(undefined8 *)(Reader + 0x20) = 0;
  puVar7 = &result;
  (**(code **)(*(long *)in_RDX + 0x38))(puVar7);
  if (-1 < _result) {
    if (read_count < 0x11) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"Short read of Key and Length got %u\n",(ulong)read_count);
      puVar7 = Kumu::RESULT_READFAIL;
    }
    else {
      if (CONCAT13(tmp_data[3],CONCAT12(tmp_data[2],CONCAT11(tmp_data[1],tmp_data[0]))) ==
          0x342b0e06) {
        cVar2 = Kumu::read_BER(tmp_data + 0x10,&tmp_size);
        if (cVar2 != '\0') {
          iVar3 = 0;
          if ((tmp_data._16_4_ & 0xf0) == 0x80) {
            iVar3 = (tmp_data._16_4_ & 0xf) + 1;
          }
          *(int *)(Reader + 0x10) = iVar3 + 0x10;
          if (tmp_size < 0x4000001) {
            *(ui64_t *)(Reader + 0x20) = tmp_size;
            uVar6 = iVar3 + 0x10 + (int)tmp_size;
            FrameBuffer::Capacity((FrameBuffer *)&tmp_size_str,(int)Reader + 0x48);
            puVar7 = &result;
            Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)&tmp_size_str);
            Kumu::Result_t::~Result_t((Result_t *)&tmp_size_str);
            if (-1 < _result) {
              __dest = *(undefined4 **)(Reader + 0x50);
              *(undefined4 **)(Reader + 8) = __dest;
              *(ulong *)(Reader + 0x18) = (ulong)*(uint *)(Reader + 0x10) + (long)__dest;
              *(uint *)(Reader + 0x60) = uVar6;
              if (uVar6 < 0x21) {
                if (read_count < uVar6) {
                  __assert_fail("packet_length <= read_count",
                                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                                ,0x111,
                                "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                               );
                }
                memcpy(__dest,tmp_data,(ulong)uVar6);
                if (read_count - uVar6 != 0) {
                  pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Warn(pIVar4,"Repositioning pointer for short packet\n");
                  iVar5 = Kumu::IFileReader::TellPosition(in_RDX);
                  if (iVar5 <= (long)(ulong)(read_count - uVar6)) {
                    __assert_fail("pos > remainder",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                                  ,0x118,
                                  "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                                 );
                  }
                  (**(code **)(*(long *)in_RDX + 0x28))(&tmp_size_str);
                  puVar7 = &result;
                  Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)&tmp_size_str);
                  Kumu::Result_t::~Result_t((Result_t *)&tmp_size_str);
                }
              }
              else if (read_count < 0x20) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error
                          (pIVar4,"Short read of packet body, expecting %u, got %u\n",
                           (ulong)*(uint *)(Reader + 0x60),(ulong)read_count);
                puVar7 = Kumu::RESULT_READFAIL;
              }
              else {
                __dest[4] = tmp_data._16_4_;
                __dest[5] = tmp_data._20_4_;
                __dest[6] = tmp_data._24_4_;
                __dest[7] = tmp_data._28_4_;
                *__dest = CONCAT13(tmp_data[3],
                                   CONCAT12(tmp_data[2],CONCAT11(tmp_data[1],tmp_data[0])));
                __dest[1] = tmp_data._4_4_;
                __dest[2] = tmp_data._8_4_;
                __dest[3] = tmp_data._12_4_;
                uVar6 = *(uint *)(Reader + 0x60);
                if (uVar6 != 0x20) {
                  (**(code **)(*(long *)in_RDX + 0x38))(&tmp_size_str);
                  puVar7 = &result;
                  Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)&tmp_size_str);
                  Kumu::Result_t::~Result_t((Result_t *)&tmp_size_str);
                  if (read_count != uVar6 - 0x20) {
                    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                    Kumu::ILogSink::Error
                              (pIVar4,"Short read of packet body, expecting %u, got %u\n",
                               (ulong)uVar6,(ulong)(read_count + 0x20));
                    puVar7 = &result;
                    Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)Kumu::RESULT_READFAIL);
                  }
                }
              }
            }
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
          }
          else {
            (**(code **)(*(long *)in_RDX + 0x28))(&tmp_size_str);
            Kumu::Result_t::operator=(&result,(Result_t *)&tmp_size_str);
            Kumu::Result_t::~Result_t((Result_t *)&tmp_size_str);
            if (-1 < _result) {
              puVar1 = *(undefined8 **)(Reader + 0x50);
              *puVar1 = CONCAT44(tmp_data._4_4_,
                                 CONCAT13(tmp_data[3],
                                          CONCAT12(tmp_data[2],CONCAT11(tmp_data[1],tmp_data[0]))));
              puVar1[1] = CONCAT44(tmp_data._12_4_,tmp_data._8_4_);
              *(undefined8 *)(Reader + 8) = *(undefined8 *)(Reader + 0x50);
              Kumu::ui64Printer::ui64Printer(&tmp_size_str,tmp_size);
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error
                        (pIVar4,"Packet length %s exceeds internal limit.\n",
                         tmp_size_str.super_IntPrinter<unsigned_long_long,_32>.m_strbuf);
              Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_ALLOC);
              std::__cxx11::string::~string((string *)&tmp_size_str);
            }
            Kumu::Result_t::Result_t((Result_t *)this,&result);
          }
          goto LAB_00191a0f;
        }
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar4,"BER Length decoding error\n");
      }
      else {
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar4,"Unexpected UL preamble: %02x.%02x.%02x.%02x\n",(ulong)tmp_data[0],
                   (ulong)tmp_data[1],(ulong)tmp_data[2],(ulong)tmp_data[3]);
      }
      puVar7 = Kumu::RESULT_FAIL;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
LAB_00191a0f:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader& Reader)
{
  ui32_t read_count;
  byte_t tmp_data[tmp_read_size];
  ui64_t tmp_size;
  m_KeyStart = m_ValueStart = 0;
  m_KLLength = m_ValueLength = 0;
  m_Buffer.Size(0);

  Result_t result = Reader.Read(tmp_data, tmp_read_size, &read_count);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( read_count < (SMPTE_UL_LENGTH + 1) )
    {
      DefaultLogSink().Error("Short read of Key and Length got %u\n", read_count);
      return RESULT_READFAIL;
    }

  if ( memcmp(tmp_data, SMPTE_UL_START, 4) != 0 )
    {
      DefaultLogSink().Error("Unexpected UL preamble: %02x.%02x.%02x.%02x\n",
			     tmp_data[0], tmp_data[1], tmp_data[2], tmp_data[3]);
      return RESULT_FAIL;
    }

  if ( ! Kumu::read_BER(tmp_data + SMPTE_UL_LENGTH, &tmp_size) )
    {
      DefaultLogSink().Error("BER Length decoding error\n");
      return RESULT_FAIL;
    }

  ui32_t ber_len = Kumu::BER_length(tmp_data + SMPTE_UL_LENGTH);
  m_KLLength = SMPTE_UL_LENGTH + ber_len;

  if ( tmp_size > MAX_KLV_PACKET_LENGTH )
    {
      result = Reader.Seek(tmp_size - (tmp_read_size - SMPTE_UL_LENGTH - ber_len), Kumu::SP_POS);

      if ( ASDCP_SUCCESS(result) )
        {
          memcpy(m_Buffer.Data(), tmp_data, SMPTE_UL_LENGTH);
          m_KeyStart = m_Buffer.Data();

          Kumu::ui64Printer tmp_size_str(tmp_size);
          DefaultLogSink().Error("Packet length %s exceeds internal limit.\n", tmp_size_str.c_str());
          result = RESULT_ALLOC;
        }

      return result;
    }

  ui32_t remainder = 0;
  assert(tmp_size <= 0xFFFFFFFFL);
  m_ValueLength = (ui32_t) tmp_size;
  ui32_t packet_length = m_ValueLength + m_KLLength;

  result = m_Buffer.Capacity(packet_length);

  if ( ASDCP_FAILURE(result) )
    return result;

  m_KeyStart = m_Buffer.Data();
  m_ValueStart = m_Buffer.Data() + m_KLLength;
  m_Buffer.Size(packet_length);

  // is the whole packet in the tmp buf?
  if ( packet_length <= tmp_read_size )
    {
      assert(packet_length <= read_count);
      memcpy(m_Buffer.Data(), tmp_data, packet_length);

      if ( (remainder = read_count - packet_length) != 0 )
	{
	  DefaultLogSink().Warn("Repositioning pointer for short packet\n");
	  Kumu::fpos_t pos = Reader.TellPosition();
	  assert(pos > remainder);
	  result = Reader.Seek(pos - remainder);
	}
    }
  else
    {
      if ( read_count < tmp_read_size )
	{
	  DefaultLogSink().Error("Short read of packet body, expecting %u, got %u\n",
				 m_Buffer.Size(), read_count);
	  return RESULT_READFAIL;
	}

      memcpy(m_Buffer.Data(), tmp_data, tmp_read_size);
      remainder = m_Buffer.Size() - tmp_read_size;

      if ( remainder > 0 )
	{
	  result = Reader.Read(m_Buffer.Data() + tmp_read_size, remainder, &read_count);
      
	  if ( read_count != remainder )
	    {
	      DefaultLogSink().Error("Short read of packet body, expecting %u, got %u\n",
				     remainder+tmp_read_size, read_count+tmp_read_size);
	      result = RESULT_READFAIL;
	    }
	}
    }

  return result;
}